

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Builder::Build(Builder *this,string *err)

{
  BuildConfig *config;
  CommandRunner *pCVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  RealCommandRunner *this_00;
  Edge *this_01;
  bool bVar6;
  int iVar7;
  int local_68;
  allocator<char> local_61;
  Result result;
  
  if (((this->plan_).wanted_edges_ < 1) || ((this->plan_).command_edges_ < 1)) {
    __assert_fail("!AlreadyUpToDate()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc",
                  0x289,"bool Builder::Build(string *)");
  }
  (**this->status_->_vptr_Status)();
  config = this->config_;
  iVar7 = *(int *)(config + 0x10);
  if ((this->command_runner_)._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl == (CommandRunner *)0x0) {
    if (config[4] == (BuildConfig)0x1) {
      this_00 = (RealCommandRunner *)operator_new(0x58);
      (this_00->super_CommandRunner)._vptr_CommandRunner =
           (_func_int **)&PTR__DryRunCommandRunner_00133920;
      std::queue<Edge*,std::deque<Edge*,std::allocator<Edge*>>>::
      queue<std::deque<Edge*,std::allocator<Edge*>>,void>
                ((queue<Edge_*,_std::deque<Edge_*,_std::allocator<Edge_*>_>_> *)&this_00->config_);
    }
    else {
      this_00 = (RealCommandRunner *)operator_new(0x308);
      RealCommandRunner::RealCommandRunner(this_00,config);
    }
    pCVar1 = (this->command_runner_)._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    (this->command_runner_)._M_t.
    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl = &this_00->super_CommandRunner;
    if (pCVar1 != (CommandRunner *)0x0) {
      (*pCVar1->_vptr_CommandRunner[1])();
    }
  }
  (*this->status_->_vptr_Status[4])();
  local_68 = 0;
LAB_00109291:
  do {
    while( true ) {
      bVar6 = (this->plan_).command_edges_ < 1 || (this->plan_).wanted_edges_ < 1;
      if (bVar6) goto LAB_00109466;
      bVar2 = 0;
      if ((iVar7 != 0) &&
         ((this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) break;
LAB_00109382:
      if (local_68 == 0) {
        (*this->status_->_vptr_Status[5])();
        std::__cxx11::string::assign((char *)err);
        return bVar6;
      }
      result.edge = (Edge *)0x0;
      result.output._M_dataplus._M_p = (pointer)&result.output.field_2;
      result.output._M_string_length = 0;
      result.output.field_2._M_local_buf[0] = '\0';
      pCVar1 = (this->command_runner_)._M_t.
               super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
               super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
               super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      iVar5 = (*pCVar1->_vptr_CommandRunner[5])(pCVar1,&result,(ulong)bVar2);
      if (((byte)iVar5 & result.status != ExitInterrupted) == 0) {
        Cleanup(this);
        (*this->status_->_vptr_Status[5])();
        std::__cxx11::string::assign((char *)err);
LAB_00109428:
        bVar3 = false;
      }
      else {
        bVar3 = true;
        if (result.status != ExitTokenAvailable) {
          bVar4 = FinishCommand(this,&result,err);
          local_68 = local_68 + -1;
          if (!bVar4) {
            Cleanup(this);
            (*this->status_->_vptr_Status[5])();
            goto LAB_00109428;
          }
          iVar7 = iVar7 - (uint)(result.status != ExitSuccess && iVar7 != 0);
        }
      }
      std::__cxx11::string::~string((string *)&result.output);
      if (!bVar3) {
        return bVar6;
      }
    }
    iVar5 = (*((this->command_runner_)._M_t.
               super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
               super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
               super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->_vptr_CommandRunner[2])
                      ();
    if ((char)iVar5 == '\0') {
      bVar2 = 0;
      goto LAB_00109382;
    }
    iVar5 = (*((this->command_runner_)._M_t.
               super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
               super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
               super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->_vptr_CommandRunner[3])
                      ();
    if ((char)iVar5 == '\0') {
      bVar2 = 1;
      goto LAB_00109382;
    }
    this_01 = Plan::FindWork(&this->plan_);
    std::__cxx11::string::string<std::allocator<char>>((string *)&result,"generator",&local_61);
    bVar3 = Edge::GetBindingBool(this_01,(string *)&result);
    std::__cxx11::string::~string((string *)&result);
    if (bVar3) {
      BuildLog::Close((this->scan_).build_log_);
    }
    bVar3 = StartEdge(this,this_01,err);
    if (!bVar3) goto LAB_0010945e;
    bVar3 = Edge::is_phony(this_01);
    if (!bVar3) {
      local_68 = local_68 + 1;
      goto LAB_00109291;
    }
    bVar3 = Plan::EdgeFinished(&this->plan_,this_01,kEdgeSucceeded,err);
    if (!bVar3) {
LAB_0010945e:
      Cleanup(this);
LAB_00109466:
      (*this->status_->_vptr_Status[5])();
      return bVar6;
    }
  } while( true );
}

Assistant:

bool Builder::Build(string* err) {
  assert(!AlreadyUpToDate());

  status_->PlanHasTotalEdges(plan_.command_edge_count());
  int pending_commands = 0;
  int failures_allowed = config_.failures_allowed;

  // Set up the command runner if we haven't done so already.
  if (!command_runner_.get()) {
    if (config_.dry_run)
      command_runner_.reset(new DryRunCommandRunner);
    else
      command_runner_.reset(new RealCommandRunner(config_));
  }

  // We are about to start the build process.
  status_->BuildStarted();

  // This main loop runs the entire build process.
  // It is structured like this:
  // First, we attempt to start as many commands as allowed by the
  // command runner.
  // Second, we attempt to wait for / reap the next finished command.
  while (plan_.more_to_do()) {
    // See if we can start any more commands...
    bool can_run_more =
        failures_allowed   &&
        plan_.more_ready() &&
        command_runner_->CanRunMore();

    // ... but we also need a token to do that.
    if (can_run_more && command_runner_->AcquireToken()) {
      Edge* edge = plan_.FindWork();
      if (edge->GetBindingBool("generator")) {
        scan_.build_log()->Close();
      }
      if (!StartEdge(edge, err)) {
        Cleanup();
        status_->BuildFinished();
        return false;
      }

      if (edge->is_phony()) {
        if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err)) {
          Cleanup();
          status_->BuildFinished();
          return false;
        }
      } else {
        ++pending_commands;
      }

      // We made some progress; go back to the main loop.
      continue;
    }

    // See if we can reap any finished commands.
    if (pending_commands) {
      CommandRunner::Result result;
      if (!command_runner_->WaitForCommand(&result, can_run_more) ||
          result.status == ExitInterrupted) {
        Cleanup();
        status_->BuildFinished();
        *err = "interrupted by user";
        return false;
      }

      // We might be able to start another command; start the main loop over.
      if (result.status == ExitTokenAvailable)
        continue;

      --pending_commands;
      if (!FinishCommand(&result, err)) {
        Cleanup();
        status_->BuildFinished();
        return false;
      }

      if (!result.success()) {
        if (failures_allowed)
          failures_allowed--;
      }

      // We made some progress; start the main loop over.
      continue;
    }

    // If we get here, we cannot make any more progress.
    status_->BuildFinished();
    if (failures_allowed == 0) {
      if (config_.failures_allowed > 1)
        *err = "subcommands failed";
      else
        *err = "subcommand failed";
    } else if (failures_allowed < config_.failures_allowed)
      *err = "cannot make progress due to previous errors";
    else
      *err = "stuck [this is a bug]";

    return false;
  }

  status_->BuildFinished();
  return true;
}